

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

unsigned_long_long ZSTD_findDecompressedSize(void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  unsigned_long_long uVar3;
  size_t code;
  void *in_RSI;
  size_t frameSrcSize;
  unsigned_long_long ret;
  size_t skippableSize;
  U32 magicNumber;
  unsigned_long_long totalDstSize;
  void *in_stack_ffffffffffffffb8;
  unsigned_long_long local_8;
  
  local_8 = 0;
  while( true ) {
    while( true ) {
      if (in_RSI < (void *)0x5) {
        if (in_RSI != (void *)0x0) {
          local_8 = 0xfffffffffffffffe;
        }
        return local_8;
      }
      UVar1 = MEM_readLE32(in_stack_ffffffffffffffb8);
      if ((UVar1 & 0xfffffff0) == 0x184d2a50) break;
      uVar3 = ZSTD_getFrameContentSize(in_RSI,local_8);
      if (0xfffffffffffffffd < uVar3) {
        return uVar3;
      }
      if (local_8 + uVar3 < local_8) {
        return 0xfffffffffffffffe;
      }
      local_8 = uVar3 + local_8;
      code = ZSTD_findFrameCompressedSize((void *)skippableSize,ret);
      uVar2 = ERR_isError(code);
      if (uVar2 != 0) {
        return 0xfffffffffffffffe;
      }
      in_RSI = (void *)((long)in_RSI - code);
    }
    if (in_RSI < (void *)0x8) {
      return 0xffffffffffffffb8;
    }
    UVar1 = MEM_readLE32(in_stack_ffffffffffffffb8);
    if (in_RSI < (void *)((ulong)UVar1 + 8)) break;
    in_RSI = (void *)((long)in_RSI - (long)((ulong)UVar1 + 8));
  }
  return 0xfffffffffffffffe;
}

Assistant:

unsigned long long ZSTD_findDecompressedSize(const void* src, size_t srcSize)
{
    unsigned long long totalDstSize = 0;

    while (srcSize >= ZSTD_frameHeaderSize_prefix) {
        U32 const magicNumber = MEM_readLE32(src);

        if ((magicNumber & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {
            size_t skippableSize;
            if (srcSize < ZSTD_skippableHeaderSize)
                return ERROR(srcSize_wrong);
            skippableSize = MEM_readLE32((const BYTE *)src + ZSTD_frameIdSize)
                          + ZSTD_skippableHeaderSize;
            if (srcSize < skippableSize) {
                return ZSTD_CONTENTSIZE_ERROR;
            }

            src = (const BYTE *)src + skippableSize;
            srcSize -= skippableSize;
            continue;
        }

        {   unsigned long long const ret = ZSTD_getFrameContentSize(src, srcSize);
            if (ret >= ZSTD_CONTENTSIZE_ERROR) return ret;

            /* check for overflow */
            if (totalDstSize + ret < totalDstSize) return ZSTD_CONTENTSIZE_ERROR;
            totalDstSize += ret;
        }
        {   size_t const frameSrcSize = ZSTD_findFrameCompressedSize(src, srcSize);
            if (ZSTD_isError(frameSrcSize)) {
                return ZSTD_CONTENTSIZE_ERROR;
            }

            src = (const BYTE *)src + frameSrcSize;
            srcSize -= frameSrcSize;
        }
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ZSTD_CONTENTSIZE_ERROR;

    return totalDstSize;
}